

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

void __thiscall
spvtools::opt::Function::MoveBasicBlockToAfter(Function *this,uint32_t id,BasicBlock *ip)

{
  __normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
  __position;
  iterator iVar1;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
  block_to_move;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_28;
  undefined8 local_20;
  
  iVar1 = FindBlock(this,id);
  local_28._M_head_impl =
       ((iVar1.iterator_._M_current._M_current)->_M_t).
       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
       .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
  ((iVar1.iterator_._M_current._M_current)->_M_t).
  super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>.
  _M_t.
  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl = (BasicBlock *)0x0;
  local_20 = 0;
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>*,std::vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>>,__gnu_cxx::__ops::_Iter_equals_val<decltype(nullptr)const>>
                         ((this->blocks_).
                          super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->blocks_).
                          super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ::erase(&this->blocks_,(const_iterator)__position._M_current);
  if ((local_28._M_head_impl)->function_ == ip->function_) {
    InsertBasicBlockAfter
              (this,(unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                     *)&local_28,ip);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 *)&local_28);
    return;
  }
  __assert_fail("block_to_move->GetParent() == ip->GetParent() && \"Both blocks have to be in the same function.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/function.h"
                ,0xf7,"void spvtools::opt::Function::MoveBasicBlockToAfter(uint32_t, BasicBlock *)")
  ;
}

Assistant:

inline void Function::MoveBasicBlockToAfter(uint32_t id, BasicBlock* ip) {
  std::unique_ptr<BasicBlock> block_to_move = std::move(*FindBlock(id).Get());
  blocks_.erase(std::find(std::begin(blocks_), std::end(blocks_), nullptr));

  assert(block_to_move->GetParent() == ip->GetParent() &&
         "Both blocks have to be in the same function.");

  InsertBasicBlockAfter(std::move(block_to_move), ip);
}